

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  XML_Convert_Result XVar3;
  ulong uVar4;
  char **ppcVar5;
  long lVar6;
  unsigned_short **ppuVar7;
  uint uVar8;
  char *pcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  int iVar10;
  int iVar11;
  unsigned_short *in_R8;
  
  ppcVar5 = (char **)(end + -(long)ptr);
  if ((long)ppcVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar10 = 0;
  uVar8 = bVar1 - 5;
  if (uVar8 < 0x14) {
    pcVar9 = (char *)((long)&switchD_00179db9::switchdataD_001a7ac4 +
                     (long)(int)(&switchD_00179db9::switchdataD_001a7ac4)[uVar8]);
    iVar11 = 0;
    switch((uint)bVar1) {
    case 5:
      if (ppcVar5 == (char **)0x1) {
        return -2;
      }
      iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar9,ppcVar5);
      iVar11 = iVar10;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar5);
        while( true ) {
          lVar6 = 2;
          while( true ) {
            iVar11 = iVar10;
            if (XVar3 == XML_CONVERT_COMPLETED) goto switchD_00179db9_caseD_8;
LAB_00179e7b:
            while( true ) {
              ptr = (char *)((long)ptr + lVar6);
              uVar4 = (long)end - (long)ptr;
              if ((long)uVar4 < 1) {
                return -1;
              }
              ppuVar7 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar7);
              pcVar9 = (char *)(ulong)bVar1;
              if (bVar1 < 0x12) break;
              lVar6 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar11 = iVar10;
                if (bVar1 == 0x12) {
                  ptr = (char *)((long)ptr + 1);
                  iVar11 = 0x1c;
                }
                goto switchD_00179db9_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (uVar4 < 3) {
                return -2;
              }
              iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar9,(char **)ppuVar7);
              iVar11 = iVar10;
              if (iVar2 != 0) goto switchD_00179db9_caseD_8;
              XVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_00179f4b:
              lVar6 = 3;
            }
            else {
              iVar11 = iVar10;
              if (bVar1 != 7) goto switchD_00179db9_caseD_8;
              if (uVar4 < 4) {
                return -2;
              }
              iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar9,(char *)ppuVar7);
              if (iVar2 != 0) goto switchD_00179db9_caseD_8;
              XVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,(char **)ppuVar7);
LAB_00179f0c:
              lVar6 = 4;
            }
          }
          if (uVar4 == 1) {
            return -2;
          }
          iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar9,(char **)ppuVar7);
          iVar11 = iVar10;
          if (iVar2 != 0) break;
          XVar3 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_03,ppuVar7,in_R8);
        }
      }
      break;
    case 6:
      if (ppcVar5 < (char **)0x3) {
        return -2;
      }
      iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar9,ppcVar5);
      iVar11 = iVar10;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX,ppcVar5);
        goto LAB_00179f4b;
      }
      break;
    case 7:
      if (ppcVar5 < (char **)0x4) {
        return -2;
      }
      iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar9,(char *)ppcVar5);
      iVar11 = iVar10;
      if (iVar2 == 0) {
        XVar3 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_01,ppcVar5);
        goto LAB_00179f0c;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00179db9_caseD_9;
    case 0x16:
    case 0x18:
      lVar6 = 1;
      goto LAB_00179e7b;
    }
  }
  else {
    iVar11 = iVar10;
    if (bVar1 != 0x1e) goto switchD_00179db9_caseD_8;
switchD_00179db9_caseD_9:
    iVar11 = 0x16;
  }
switchD_00179db9_caseD_8:
  *nextTokPtr = ptr;
  return iVar11;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}